

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationElementIterator::previous(CollationElementIterator *this,UErrorCode *status)

{
  CollationIterator *pCVar1;
  UBool UVar2;
  uint uVar3;
  int32_t iVar4;
  uint32_t uVar5;
  int elem;
  UVector32 *pUVar6;
  int64_t iVar7;
  UErrorCode *size;
  int32_t local_84;
  UVector32 *local_78;
  uint32_t secondHalf;
  uint32_t firstHalf;
  uint32_t lower32;
  uint32_t p;
  int64_t ce;
  int32_t limitOffset;
  uint32_t oh;
  UErrorCode *status_local;
  CollationElementIterator *this_local;
  
  size = status;
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 == '\0') {
    if (this->dir_ < '\0') {
      if (this->otherHalf_ != 0) {
        uVar5 = this->otherHalf_;
        this->otherHalf_ = 0;
        return uVar5;
      }
    }
    else if (this->dir_ == '\0') {
      pCVar1 = this->iter_;
      uVar3 = UnicodeString::length(&this->string_);
      size = (UErrorCode *)(ulong)uVar3;
      (*(pCVar1->super_UObject)._vptr_UObject[4])();
      this->dir_ = -1;
    }
    else {
      if (this->dir_ != '\x01') {
        *status = U_INVALID_STATE_ERROR;
        return -1;
      }
      this->dir_ = -1;
    }
    if (this->offsets_ == (UVector32 *)0x0) {
      pUVar6 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)size);
      local_78 = (UVector32 *)0x0;
      if (pUVar6 != (UVector32 *)0x0) {
        UVector32::UVector32(pUVar6,status);
        local_78 = pUVar6;
      }
      this->offsets_ = local_78;
      if (this->offsets_ == (UVector32 *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return -1;
      }
    }
    iVar4 = CollationIterator::getCEsLength(this->iter_);
    if (iVar4 == 0) {
      local_84 = (*(this->iter_->super_UObject)._vptr_UObject[5])();
    }
    else {
      local_84 = 0;
    }
    iVar7 = CollationIterator::previousCE(this->iter_,this->offsets_,status);
    if (iVar7 == 0x101000100) {
      this_local._4_4_ = 0xffffffff;
    }
    else {
      uVar5 = (uint32_t)((ulong)iVar7 >> 0x20);
      this_local._4_4_ = anon_unknown_16::getFirstHalf(uVar5,(uint32_t)iVar7);
      uVar5 = anon_unknown_16::getSecondHalf(uVar5,(uint32_t)iVar7);
      if (uVar5 != 0) {
        UVar2 = UVector32::isEmpty(this->offsets_);
        if (UVar2 != '\0') {
          pUVar6 = this->offsets_;
          elem = (*(this->iter_->super_UObject)._vptr_UObject[5])();
          UVector32::addElement(pUVar6,elem,status);
          UVector32::addElement(this->offsets_,local_84,status);
        }
        this->otherHalf_ = this_local._4_4_;
        this_local._4_4_ = uVar5 | 0xc0;
      }
    }
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

int32_t CollationElementIterator::previous(UErrorCode& status)
{
    if (U_FAILURE(status)) { return NULLORDER; }
    if (dir_ < 0) {
        // Continue backwards iteration. Test this first.
        if (otherHalf_ != 0) {
            uint32_t oh = otherHalf_;
            otherHalf_ = 0;
            return oh;
        }
    } else if (dir_ == 0) {
        iter_->resetToOffset(string_.length());
        dir_ = -1;
    } else if (dir_ == 1) {
        // previous() after setOffset()
        dir_ = -1;
    } else /* dir_ > 1 */ {
        // illegal change of direction
        status = U_INVALID_STATE_ERROR;
        return NULLORDER;
    }
    if (offsets_ == NULL) {
        offsets_ = new UVector32(status);
        if (offsets_ == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return NULLORDER;
        }
    }
    // If we already have expansion CEs, then we also have offsets.
    // Otherwise remember the trailing offset in case we need to
    // write offsets for an artificial expansion.
    int32_t limitOffset = iter_->getCEsLength() == 0 ? iter_->getOffset() : 0;
    int64_t ce = iter_->previousCE(*offsets_, status);
    if (ce == Collation::NO_CE) { return NULLORDER; }
    // Turn the 64-bit CE into two old-style 32-bit CEs, without quaternary bits.
    uint32_t p = (uint32_t)(ce >> 32);
    uint32_t lower32 = (uint32_t)ce;
    uint32_t firstHalf = getFirstHalf(p, lower32);
    uint32_t secondHalf = getSecondHalf(p, lower32);
    if (secondHalf != 0) {
        if (offsets_->isEmpty()) {
            // When we convert a single 64-bit CE into two 32-bit CEs,
            // we need to make this artificial expansion behave like a normal expansion.
            // See CollationIterator::previousCE().
            offsets_->addElement(iter_->getOffset(), status);
            offsets_->addElement(limitOffset, status);
        }
        otherHalf_ = firstHalf;
        return secondHalf | 0xc0;  // continuation CE
    }
    return firstHalf;
}